

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncat.c
# Opt level: O3

char * strncat(char *__dest,char *__src,size_t __n)

{
  long lVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *rc;
  long lVar5;
  
  pcVar3 = __dest;
  do {
    pcVar4 = pcVar3;
    pcVar3 = pcVar4 + 1;
  } while (*pcVar4 != '\0');
  if (__n != 0) {
    lVar5 = -1;
    do {
      cVar2 = __src[lVar5 + 1];
      pcVar3[lVar5] = cVar2;
      if (cVar2 == '\0') {
        return __dest;
      }
      lVar1 = lVar5 - __n;
      lVar5 = lVar5 + 1;
    } while (lVar1 != -2);
    pcVar4 = pcVar3 + lVar5;
  }
  *pcVar4 = '\0';
  return __dest;
}

Assistant:

char * strncat( char * _PDCLIB_restrict s1, const char * _PDCLIB_restrict s2, size_t n )
{
    char * rc = s1;

    while ( *s1 )
    {
        ++s1;
    }

    while ( n && ( *s1++ = *s2++ ) )
    {
        --n;
    }

    if ( n == 0 )
    {
        *s1 = '\0';
    }

    return rc;
}